

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::OnIndexedFuncRef(TypeChecker *this,Index *out_index)

{
  Result RVar1;
  Result RVar2;
  Index IVar3;
  Result RVar4;
  Type in_RAX;
  Type type;
  
  type = in_RAX;
  RVar1 = PeekType(this,0,&type);
  if (type.enum_ != Reference) {
    type.enum_ = Reference;
    type.type_index_ = 0xffffffff;
  }
  RVar2 = PopAndCheck1Type(this,type,"call_ref");
  if (RVar2.enum_ != Error && RVar1.enum_ != Error) {
    IVar3 = Type::GetReferenceIndex(&type);
    *out_index = IVar3;
  }
  RVar4.enum_._1_3_ = 0;
  RVar4.enum_._0_1_ = RVar2.enum_ == Error || RVar1.enum_ == Error;
  return (Result)RVar4.enum_;
}

Assistant:

Result TypeChecker::OnIndexedFuncRef(Index* out_index) {
  Type type;
  Result result = PeekType(0, &type);
  if (!type.IsReferenceWithIndex()) {
    type = Type(Type::Reference, kInvalidIndex);
  }
  result |= PopAndCheck1Type(type, "call_ref");
  if (Succeeded(result)) {
    *out_index = type.GetReferenceIndex();
  }
  return result;
}